

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O0

int main(int argc,char **argv)

{
  char *pcVar1;
  size_t sVar2;
  ulong local_2020;
  size_t n;
  char *strings [1024];
  char **argv_local;
  int argc_local;
  
  strings[0x3ff] = (char *)argv;
  memcpy(&n,&PTR_anon_var_dwarf_23_00103df0,0x2000);
  for (local_2020 = 0; local_2020 < 4; local_2020 = local_2020 + 1) {
    pcVar1 = strings[local_2020 - 1];
    sVar2 = my_strlen(strings[local_2020 - 1]);
    printf("\'%s\' is %zu characters long.\n",pcVar1,sVar2);
  }
  return 0;
}

Assistant:

int main(int argc, char** argv) {
  char* strings[1024] = {
    "bread",
    "The night sky is bright.",
    "Are we there yet?",
    "🐺"
  };

  for (size_t n = 0; n < 4; n++) {
    printf("'%s' is %zu characters long.\n", strings[n], my_strlen(strings[n]));
  }

  return 0;
}